

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

char * deqp::gles2::Functional::MatrixCaseUtils::getOperationName(MatrixOp op)

{
  char *pcStack_10;
  MatrixOp op_local;
  
  switch(op) {
  case OP_ADD:
    pcStack_10 = "+";
    break;
  case OP_SUB:
    pcStack_10 = "-";
    break;
  case OP_MUL:
    pcStack_10 = "*";
    break;
  case OP_DIV:
    pcStack_10 = "/";
    break;
  case OP_COMP_MUL:
    pcStack_10 = "matrixCompMult";
    break;
  case OP_UNARY_PLUS:
    pcStack_10 = "+";
    break;
  case OP_NEGATION:
    pcStack_10 = "-";
    break;
  case OP_PRE_INCREMENT:
    pcStack_10 = "++";
    break;
  case OP_PRE_DECREMENT:
    pcStack_10 = "--";
    break;
  case OP_POST_INCREMENT:
    pcStack_10 = "++";
    break;
  case OP_POST_DECREMENT:
    pcStack_10 = "--";
    break;
  case OP_ADD_INTO:
    pcStack_10 = "+=";
    break;
  case OP_SUBTRACT_FROM:
    pcStack_10 = "-=";
    break;
  case OP_MULTIPLY_INTO:
    pcStack_10 = "*=";
    break;
  case OP_DIVIDE_INTO:
    pcStack_10 = "/=";
    break;
  default:
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

static const char* getOperationName (MatrixOp op)
{
	switch (op)
	{
		case OP_ADD:			return "+";
		case OP_SUB:			return "-";
		case OP_MUL:			return "*";
		case OP_DIV:			return "/";
		case OP_COMP_MUL:		return "matrixCompMult";
		case OP_UNARY_PLUS:		return "+";
		case OP_NEGATION:		return "-";
		case OP_PRE_INCREMENT:	return "++";
		case OP_PRE_DECREMENT:	return "--";
		case OP_POST_INCREMENT:	return "++";
		case OP_POST_DECREMENT:	return "--";
		case OP_ADD_INTO:		return "+=";
		case OP_SUBTRACT_FROM:	return "-=";
		case OP_MULTIPLY_INTO:	return "*=";
		case OP_DIVIDE_INTO:	return "/=";
		default:
			DE_ASSERT(DE_FALSE);
			return "";
	}
}